

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  Descriptor *pDVar2;
  DescriptorStringView __lhs;
  pointer pMVar3;
  Descriptor *pDVar4;
  type message1_00;
  type message2_00;
  Reflection *this_00;
  Reflection *this_01;
  UnknownFieldSet *unknown_field_set1_00;
  UnknownFieldSet *unknown_field_set2_00;
  byte local_f3;
  undefined1 local_b0 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message2_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message1_fields;
  UnknownFieldSet *unknown_field_set2;
  UnknownFieldSet *unknown_field_set1;
  Reflection *reflection2;
  Reflection *reflection1;
  bool unknown_compare_result;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_48;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> data2;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> data1;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  pDVar2 = Message::GetDescriptor(message1);
  __lhs = Descriptor::full_name_abi_cxx11_(pDVar2);
  bVar1 = std::operator==(__lhs,"google.protobuf.Any");
  if (bVar1) {
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&data2);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_48);
    bVar1 = UnpackAnyField::UnpackAny(&this->unpack_any_field_,message1,&data2);
    if ((bVar1) &&
       (bVar1 = UnpackAnyField::UnpackAny(&this->unpack_any_field_,message2,&local_48), bVar1)) {
      pMVar3 = std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&data2);
      pDVar2 = Message::GetDescriptor(pMVar3);
      pMVar3 = std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&local_48);
      pDVar4 = Message::GetDescriptor(pMVar3);
      if (pDVar2 != pDVar4) goto LAB_0059f063;
      message1_00 = std::
                    unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                    ::operator*(&data2);
      message2_00 = std::
                    unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                    ::operator*(&local_48);
      this_local._7_1_ = Compare(this,message1_00,message2_00,unpacked_any + 1,parent_fields);
      bVar1 = true;
    }
    else {
LAB_0059f063:
      bVar1 = false;
    }
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_48);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&data2);
    if (bVar1) goto LAB_0059f205;
  }
  reflection1._7_1_ = 1;
  if (this->message_field_comparison_ != EQUIVALENT) {
    this_00 = Message::GetReflection(message1);
    this_01 = Message::GetReflection(message2);
    unknown_field_set1_00 = Reflection::GetUnknownFields(this_00,message1);
    unknown_field_set2_00 = Reflection::GetUnknownFields(this_01,message2);
    bVar1 = CompareUnknownFields
                      (this,message1,message2,unknown_field_set1_00,unknown_field_set2_00,
                       parent_fields);
    if (!bVar1) {
      if (this->reporter_ == (Reporter *)0x0) {
        this_local._7_1_ = 0;
        goto LAB_0059f205;
      }
      reflection1._7_1_ = 0;
    }
  }
  RetrieveFields((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&message2_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this,message1,true);
  RetrieveFields((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_b0,this,message2,false);
  bVar1 = CompareRequestedFieldsUsingSettings
                    (this,message1,message2,unpacked_any,
                     (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&message2_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_b0,parent_fields);
  local_f3 = 0;
  if (bVar1) {
    local_f3 = reflection1._7_1_;
  }
  this_local._7_1_ = local_f3;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_b0);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&message2_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0059f205:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2, int unpacked_any,
                                 std::vector<SpecificField>* parent_fields) {
  // Expand google.protobuf.Any payload if possible.
  if (message1.GetDescriptor()->full_name() == internal::kAnyFullTypeName) {
    std::unique_ptr<Message> data1;
    std::unique_ptr<Message> data2;
    if (unpack_any_field_.UnpackAny(message1, &data1) &&
        unpack_any_field_.UnpackAny(message2, &data2) &&
        data1->GetDescriptor() == data2->GetDescriptor()) {
      return Compare(*data1, *data2, unpacked_any + 1, parent_fields);
    }
    // If the Any payload is unparsable, or the payload types are different
    // between message1 and message2, fall through and treat Any as a regular
    // proto.
  }

  bool unknown_compare_result = true;
  // Ignore unknown fields in EQUIVALENT mode
  if (message_field_comparison_ != EQUIVALENT) {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const UnknownFieldSet& unknown_field_set1 =
        reflection1->GetUnknownFields(message1);
    const UnknownFieldSet& unknown_field_set2 =
        reflection2->GetUnknownFields(message2);
    if (!CompareUnknownFields(message1, message2, unknown_field_set1,
                              unknown_field_set2, parent_fields)) {
      if (reporter_ == NULL) {
        return false;
      }
      unknown_compare_result = false;
    }
  }

  std::vector<const FieldDescriptor*> message1_fields =
      RetrieveFields(message1, true);
  std::vector<const FieldDescriptor*> message2_fields =
      RetrieveFields(message2, false);

  return CompareRequestedFieldsUsingSettings(message1, message2, unpacked_any,
                                             message1_fields, message2_fields,
                                             parent_fields) &&
         unknown_compare_result;
}